

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void EmitDestructuredArrayCore
               (ParseNode *list,RegSlot iteratorLocation,RegSlot nextMethodReg,
               RegSlot shouldCallReturnFunctionLocation,
               RegSlot shouldCallReturnFunctionLocationFinally,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot resultReg;
  RegSlot value;
  uint uVar4;
  ByteCodeLabel BVar5;
  RegSlot value_00;
  ByteCodeLabel BVar6;
  RegSlot R0;
  undefined4 *puVar7;
  ParseNodeBin *pPVar8;
  ParseNodeVar *pPVar9;
  uint uVar10;
  ParseNode *local_90;
  ParseNode *local_58;
  
  if (list == (ParseNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1924,"(list != nullptr)","list != nullptr");
    if (!bVar3) {
LAB_0081adf7:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar7 = 0;
    local_58 = (ParseNode *)0x0;
  }
  else {
    this = &byteCodeGenerator->m_writer;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      local_58 = list;
      if (list->nop == knopList) {
        pPVar8 = ParseNode::AsParseNodeBin(list);
        local_58 = pPVar8->pnode1;
      }
      OVar1 = local_58->nop;
      bVar3 = true;
      if (OVar1 - 0x51 < 3) {
        pPVar9 = ParseNode::AsParseNodeVar(local_58);
        local_90 = pPVar9->pnodeInit;
LAB_0081a877:
        ByteCodeGenerator::StartStatement(byteCodeGenerator,local_58);
        OVar1 = local_58->nop;
        uVar10 = OVar1 - 0x51;
        if ((0x21 < uVar10) || ((0x280000007U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) {
          Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
          Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
          EmitReference(local_58,byteCodeGenerator,funcInfo);
        }
        Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
        Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
        resultReg = FuncInfo::AcquireTmpRegister(funcInfo);
        EmitFunctionCall(resultReg,nextMethodReg,iteratorLocation,0xffffffff,byteCodeGenerator,
                         funcInfo);
        EmitThrowOnNotObject(resultReg,byteCodeGenerator);
        value = FuncInfo::AcquireTmpRegister(funcInfo);
        uVar4 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x74,false,false);
        Js::ByteCodeWriter::PatchableProperty(this,LdFld,value,resultReg,uVar4,false,false);
        if (local_58->nop == knopEmpty) {
          if (list->nop != knopEmpty) {
            if (list->nop == knopList) {
              pPVar8 = ParseNode::AsParseNodeBin(list);
              list = pPVar8->pnode2;
              FuncInfo::ReleaseTmpRegister(funcInfo,value);
              FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
              bVar3 = false;
              goto LAB_0081ad70;
            }
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x1976,"(list->nop == knopEmpty)","list->nop == knopEmpty");
            if (!bVar3) goto LAB_0081adf7;
            *puVar7 = 0;
          }
          EmitIteratorCloseIfNotDone(iteratorLocation,value,byteCodeGenerator,funcInfo);
          FuncInfo::ReleaseTmpRegister(funcInfo,value);
          FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
        }
        else {
          BVar5 = Js::ByteCodeWriter::DefineLabel(this);
          Js::ByteCodeWriter::BrReg1(this,BrTrue_A,BVar5,value);
          value_00 = FuncInfo::AcquireTmpRegister(funcInfo);
          uVar4 = FuncInfo::FindOrAddInlineCacheId(funcInfo,resultReg,0x197,false,false);
          Js::ByteCodeWriter::PatchableProperty(this,LdFld,value_00,resultReg,uVar4,false,false);
          BVar6 = Js::ByteCodeWriter::DefineLabel(this);
          Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,shouldCallReturnFunctionLocation);
          Js::ByteCodeWriter::Reg1(this,LdTrue_ReuseLoc,shouldCallReturnFunctionLocationFinally);
          Js::ByteCodeWriter::Br(this,BVar6);
          Js::ByteCodeWriter::MarkLabel(this,BVar5);
          Js::ByteCodeWriter::Reg2(this,Ld_A_ReuseLoc,value_00,funcInfo->undefinedConstantRegister);
          Js::ByteCodeWriter::MarkLabel(this,BVar6);
          if ((local_58->nop & ~knopInt) == knopObjectPattern) {
            if (local_90 == (ParseNode *)0x0) {
              if (local_58->nop == knopObjectPattern) {
                EmitDestructuredObject(local_58,value_00,byteCodeGenerator,funcInfo);
              }
              else {
                EmitDestructuredArray(local_58,value_00,byteCodeGenerator,funcInfo);
              }
            }
            else {
              R0 = FuncInfo::AcquireTmpRegister(funcInfo);
              ByteCodeGenerator::StartStatement(byteCodeGenerator,local_90);
              BVar5 = Js::ByteCodeWriter::DefineLabel(this);
              BVar6 = Js::ByteCodeWriter::DefineLabel(this);
              Js::ByteCodeWriter::BrReg2
                        (this,BrSrNeq_A,BVar5,value_00,funcInfo->undefinedConstantRegister);
              Emit(local_90,byteCodeGenerator,funcInfo,0,false,false);
              Js::ByteCodeWriter::Reg2(this,Ld_A,R0,local_90->location);
              FuncInfo::ReleaseLoc(funcInfo,local_90);
              Js::ByteCodeWriter::Br(this,BVar6);
              Js::ByteCodeWriter::MarkLabel(this,BVar5);
              Js::ByteCodeWriter::Reg2(this,Ld_A_ReuseLoc,R0,value_00);
              Js::ByteCodeWriter::MarkLabel(this,BVar6);
              Js::ByteCodeWriter::EndStatement(this,local_90);
              if (local_58->nop == knopObjectPattern) {
                EmitDestructuredObject(local_58,R0,byteCodeGenerator,funcInfo);
              }
              else {
                EmitDestructuredArray(local_58,R0,byteCodeGenerator,funcInfo);
              }
              FuncInfo::ReleaseTmpRegister(funcInfo,R0);
            }
          }
          else {
            EmitDestructuredValueOrInitializer
                      (local_58,value_00,local_90,
                       (OVar1 & ~knopInt) != knopObjectPattern &&
                       (byte)(OVar1 + ~knopLetDecl) < 0xfd,byteCodeGenerator,funcInfo);
          }
          Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnFunctionLocation);
          Js::ByteCodeWriter::Reg1(this,LdFalse_ReuseLoc,shouldCallReturnFunctionLocationFinally);
          if (list->nop != knopList) {
            EmitIteratorCloseIfNotDone(iteratorLocation,value,byteCodeGenerator,funcInfo);
          }
          FuncInfo::ReleaseTmpRegister(funcInfo,value_00);
          FuncInfo::ReleaseTmpRegister(funcInfo,value);
          FuncInfo::ReleaseTmpRegister(funcInfo,resultReg);
          if ((0x21 < uVar10) || ((0x280000007U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) {
            FuncInfo::ReleaseReference(funcInfo,local_58);
          }
          Js::ByteCodeWriter::EndStatement(this,local_58);
          if (list->nop == knopList) {
            pPVar8 = ParseNode::AsParseNodeBin(list);
            list = pPVar8->pnode2;
            bVar3 = false;
            goto LAB_0081ad70;
          }
        }
        bVar3 = true;
      }
      else if (OVar1 != knopEllipsis) {
        if (OVar1 == knopAsg) {
          pPVar8 = ParseNode::AsParseNodeBin(local_58);
          local_90 = pPVar8->pnode2;
          pPVar8 = ParseNode::AsParseNodeBin(local_58);
          local_58 = pPVar8->pnode1;
        }
        else {
          local_90 = (ParseNode *)0x0;
        }
        goto LAB_0081a877;
      }
LAB_0081ad70:
    } while ((!bVar3) && (list != (ParseNodePtr)0x0));
  }
  if ((local_58 != (ParseNode *)0x0) && (local_58->nop == knopEllipsis)) {
    EmitDestructuredRestArray
              (local_58,iteratorLocation,nextMethodReg,shouldCallReturnFunctionLocation,
               shouldCallReturnFunctionLocationFinally,byteCodeGenerator,funcInfo);
    return;
  }
  return;
}

Assistant:

void EmitDestructuredArrayCore(
    ParseNode* list,
    Js::RegSlot iteratorLocation,
    Js::RegSlot nextMethodReg,
    Js::RegSlot shouldCallReturnFunctionLocation,
    Js::RegSlot shouldCallReturnFunctionLocationFinally,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    Assert(list != nullptr);

    ParseNode *elem = nullptr;
    while (list != nullptr)
    {
        ParseNode *init = nullptr;

        if (list->nop == knopList)
        {
            elem = list->AsParseNodeBin()->pnode1;
        }
        else
        {
            elem = list;
        }

        if (elem->nop == knopEllipsis)
        {
            break;
        }

        switch (elem->nop)
        {
        case knopAsg:
            // An assignment node will always have an initializer
            init = elem->AsParseNodeBin()->pnode2;
            elem = elem->AsParseNodeBin()->pnode1;
            break;

        case knopVarDecl:
        case knopLetDecl:
        case knopConstDecl:
            init = elem->AsParseNodeVar()->pnodeInit;
            break;

        default:
            break;
        }

        byteCodeGenerator->StartStatement(elem);

        bool isAssignmentTarget = !(elem->IsPattern() || elem->IsVarLetOrConst());

        if (isAssignmentTarget)
        {
            byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
            byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);
            EmitReference(elem, byteCodeGenerator, funcInfo);
        }

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);

        Js::RegSlot itemLocation = funcInfo->AcquireTmpRegister();
        EmitFunctionCall(
            itemLocation,
            nextMethodReg,
            iteratorLocation,
            byteCodeGenerator,
            funcInfo);

        EmitThrowOnNotObject(itemLocation, byteCodeGenerator);

        Js::RegSlot doneLocation = funcInfo->AcquireTmpRegister();
        EmitGetObjectProperty(
            doneLocation,
            itemLocation,
            Js::PropertyIds::done,
            byteCodeGenerator,
            funcInfo);

        if (elem->nop == knopEmpty)
        {
            if (list->nop == knopList)
            {
                list = list->AsParseNodeBin()->pnode2;
                funcInfo->ReleaseTmpRegister(doneLocation);
                funcInfo->ReleaseTmpRegister(itemLocation);
                continue;
            }
            else
            {
                Assert(list->nop == knopEmpty);
                EmitIteratorCloseIfNotDone(iteratorLocation, doneLocation, byteCodeGenerator, funcInfo);
                funcInfo->ReleaseTmpRegister(doneLocation);
                funcInfo->ReleaseTmpRegister(itemLocation);
                break;
            }
        }

        // If the iterator hasn't completed, skip assigning undefined.
        Js::ByteCodeLabel iteratorAlreadyDone = byteCodeGenerator->Writer()->DefineLabel();
        byteCodeGenerator->Writer()->BrReg1(Js::OpCode::BrTrue_A, iteratorAlreadyDone, doneLocation);

        // We're not done with the iterator, so assign the .next() value.
        Js::RegSlot valueLocation = funcInfo->AcquireTmpRegister();
        EmitGetObjectProperty(
            valueLocation,
            itemLocation,
            Js::PropertyIds::value,
            byteCodeGenerator,
            funcInfo);

        Js::ByteCodeLabel beforeDefaultAssign = byteCodeGenerator->Writer()->DefineLabel();

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdTrue_ReuseLoc, shouldCallReturnFunctionLocationFinally);
        byteCodeGenerator->Writer()->Br(beforeDefaultAssign);

        // iteratorAlreadyDone:
        byteCodeGenerator->Writer()->MarkLabel(iteratorAlreadyDone);
        byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, valueLocation, funcInfo->undefinedConstantRegister);

        // beforeDefaultAssign:
        byteCodeGenerator->Writer()->MarkLabel(beforeDefaultAssign);

        if (elem->IsPattern())
        {
            // If we get an undefined value and have an initializer, use it in place of undefined.
            if (init != nullptr)
            {
                /*
                the IR builder uses two symbols for a temp register in the if else path
                R9 <- R3
                if (...)
                R9 <- R2
                R10 = R9.<property>  // error -> IR creates a new lifetime for the if path, and the direct path dest is not referenced
                hence we have to create a new temp

                TEMP REG USED TO FIX THIS PRODUCES THIS
                R9 <- R3
                if (BrEq_A R9, R3)
                R10 <- R2               :
                else
                R10 <- R9               : skipdefault
                ...  = R10[@@iterator]  : loadIter
                */

                // Temp Register
                Js::RegSlot valueLocationTmp = funcInfo->AcquireTmpRegister();
                byteCodeGenerator->StartStatement(init);

                Js::ByteCodeLabel skipDefault = byteCodeGenerator->Writer()->DefineLabel();
                Js::ByteCodeLabel loadIter = byteCodeGenerator->Writer()->DefineLabel();

                // check value is undefined
                byteCodeGenerator->Writer()->BrReg2(Js::OpCode::BrSrNeq_A, skipDefault, valueLocation, funcInfo->undefinedConstantRegister);

                // Evaluate the default expression and assign it.
                Emit(init, byteCodeGenerator, funcInfo, false);
                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, valueLocationTmp, init->location);
                funcInfo->ReleaseLoc(init);

                // jmp to loadIter
                byteCodeGenerator->Writer()->Br(loadIter);

                // skipDefault:
                byteCodeGenerator->Writer()->MarkLabel(skipDefault);
                byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A_ReuseLoc, valueLocationTmp, valueLocation);

                // loadIter:
                // @@iterator
                byteCodeGenerator->Writer()->MarkLabel(loadIter);
                byteCodeGenerator->EndStatement(init);

                if (elem->nop == knopObjectPattern)
                {
                    EmitDestructuredObject(elem, valueLocationTmp, byteCodeGenerator, funcInfo);
                }
                else
                {
                    // Recursively emit a destructured array using the current .next() as the RHS.
                    EmitDestructuredArray(elem, valueLocationTmp, byteCodeGenerator, funcInfo);
                }

                funcInfo->ReleaseTmpRegister(valueLocationTmp);
            }
            else
            {
                if (elem->nop == knopObjectPattern)
                {
                    EmitDestructuredObject(elem, valueLocation, byteCodeGenerator, funcInfo);
                }
                else
                {
                    // Recursively emit a destructured array using the current .next() as the RHS.
                    EmitDestructuredArray(elem, valueLocation, byteCodeGenerator, funcInfo);
                }
            }
        }
        else
        {
            EmitDestructuredValueOrInitializer(elem, valueLocation, init, isAssignmentTarget, byteCodeGenerator, funcInfo);
        }

        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocation);
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::LdFalse_ReuseLoc, shouldCallReturnFunctionLocationFinally);

        if (list->nop != knopList)
        {
            EmitIteratorCloseIfNotDone(iteratorLocation, doneLocation, byteCodeGenerator, funcInfo);
        }

        funcInfo->ReleaseTmpRegister(valueLocation);
        funcInfo->ReleaseTmpRegister(doneLocation);
        funcInfo->ReleaseTmpRegister(itemLocation);

        if (isAssignmentTarget)
        {
            funcInfo->ReleaseReference(elem);
        }

        byteCodeGenerator->EndStatement(elem);

        if (list->nop == knopList)
        {
            list = list->AsParseNodeBin()->pnode2;
        }
        else
        {
            break;
        }
    }

    // If we saw a rest element, emit the rest array.
    if (elem != nullptr && elem->nop == knopEllipsis)
    {
        EmitDestructuredRestArray(
            elem,
            iteratorLocation,
            nextMethodReg,
            shouldCallReturnFunctionLocation,
            shouldCallReturnFunctionLocationFinally,
            byteCodeGenerator,
            funcInfo);
    }
}